

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Combine<duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  uhugeint_t *this;
  uhugeint_t *rhs;
  uint64_t uVar3;
  bool bVar4;
  idx_t iVar5;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar5 = 0;
    do {
      this = *(uhugeint_t **)(pdVar1 + iVar5 * 8);
      if ((char)this[1].lower == '\x01') {
        rhs = *(uhugeint_t **)(pdVar2 + iVar5 * 8);
        if ((char)rhs[1].lower == '\0') {
          *(char *)&rhs[1].lower = (char)this[1].lower;
        }
        else {
          bVar4 = uhugeint_t::operator>(this,rhs);
          if (!bVar4) goto LAB_012a7ca9;
        }
        uVar3 = this->upper;
        rhs->lower = this->lower;
        rhs->upper = uVar3;
      }
LAB_012a7ca9:
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}